

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

int Js::AssertIntegerProperty(DynamicObject *state,PropertyIds propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  char *message;
  char *error;
  double value;
  Var pvVar5;
  uint lineNumber;
  char *fileName;
  Var local_30;
  Var propertyValue;
  
  local_30 = (Var)0x0;
  JavascriptOperators::GetProperty
            (&state->super_RecyclableObject,propertyId._value,&local_30,
             (((((state->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,(PropertyValueInfo *)0x0);
  if (local_30 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x183,"(propertyValue)","propertyValue");
    if (!bVar2) goto LAB_00b5b6dc;
    *puVar3 = 0;
  }
  uVar4 = (ulong)local_30 & 0x1ffff00000000;
  if (uVar4 == 0x1000000000000 || ((ulong)local_30 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)local_30 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b5b4dc;
    if ((ulong)local_30 >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x18b,"(JavascriptNumber::Is(propertyValue))",
                                  "JavascriptNumber::Is(propertyValue)");
      if (!bVar2) goto LAB_00b5b6dc;
      *puVar3 = 0;
    }
    pvVar5 = local_30;
    if (local_30 < (Var)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00b5b6dc;
      *puVar3 = 0;
    }
    value = (double)((ulong)pvVar5 ^ 0xfffc000000000000);
    pvVar5 = (Var)(ulong)(uint)(int)value;
    if (((double)(int)value == value) && (!NAN((double)(int)value) && !NAN(value))) {
      bVar2 = NumberUtilities::IsSpecial(value,0x8000000000000000);
      if (!bVar2) goto LAB_00b5b6cd;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
    ;
    error = "(JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret))";
    message = "JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret)";
    lineNumber = 0x18d;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b5b6dc;
    *puVar3 = 0;
    uVar4 = (ulong)local_30 & 0x1ffff00000000;
LAB_00b5b4dc:
    pvVar5 = local_30;
    if ((uVar4 == 0x1000000000000) || (((ulong)local_30 & 0xffff000000000000) != 0x1000000000000)) {
      if (((ulong)local_30 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b5b6cd;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
      ;
      error = "(Is(aValue))";
      message = "Ensure var is actually a \'TaggedInt\'";
      lineNumber = 0x43;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
      ;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
    }
  }
  bVar2 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar2) {
LAB_00b5b6dc:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00b5b6cd:
  return (int)pvVar5;
}

Assistant:

static int AssertIntegerProperty(_In_ DynamicObject *state, _In_ PropertyIds propertyId)
    {
        Var propertyValue = nullptr;
        JavascriptOperators::GetProperty(state, propertyId, &propertyValue, state->GetScriptContext());

        AssertOrFailFast(propertyValue);

        if (TaggedInt::Is(propertyValue))
        {
            return TaggedInt::ToInt32(propertyValue);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(propertyValue));
            int ret;
            AssertOrFailFast(JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret));

            return ret;
        }
    }